

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_find_descendant(void)

{
  byte bVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  bson_t *pbVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  bson_t *b;
  bson_iter_t desc;
  bson_iter_t iter;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 uVar9;
  undefined1 local_180 [128];
  undefined1 local_100 [232];
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  pbVar5 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  bVar1 = bson_iter_init(local_100,pbVar5);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x21a,"test_bson_iter_find_descendant","bson_iter_init (&iter, b)");
    abort();
  }
  bVar1 = bson_iter_find_descendant(local_100,"a.b.c.0",local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x21b,"test_bson_iter_find_descendant",
            "bson_iter_find_descendant (&iter, \"a.b.c.0\", &desc)");
    abort();
  }
  iVar2 = bson_iter_type(local_180);
  if (iVar2 != 0x10) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x21c,"test_bson_iter_find_descendant","BSON_ITER_HOLDS_INT32 (&desc)");
    abort();
  }
  iVar2 = bson_iter_int32(local_180);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x21d,"test_bson_iter_find_descendant","bson_iter_int32 (&desc) == 1");
    abort();
  }
  bson_destroy(pbVar5);
  uVar6 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(1);
  uVar6 = bcon_new(0,"foo","{","bar","[","{","baz",uVar6,0xf,CONCAT44(uVar9,iVar3),"}","]","}",0);
  bVar1 = bson_iter_init(local_100,uVar6);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x222,"test_bson_iter_find_descendant","bson_iter_init (&iter, b)");
    abort();
  }
  bVar1 = bson_iter_find_descendant(local_100,"foo.bar.0.baz",local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x223,"test_bson_iter_find_descendant",
            "bson_iter_find_descendant (&iter, \"foo.bar.0.baz\", &desc)");
    abort();
  }
  iVar2 = bson_iter_type(local_180);
  if (iVar2 != 0x10) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x224,"test_bson_iter_find_descendant","BSON_ITER_HOLDS_INT32 (&desc)");
    abort();
  }
  iVar2 = bson_iter_int32(local_180);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x225,"test_bson_iter_find_descendant","bson_iter_int32 (&desc) == 1");
    abort();
  }
  bson_destroy(uVar6);
  uVar6 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(1);
  uVar7 = bson_bcon_magic();
  iVar4 = bcon_ensure_int32(2);
  uVar6 = bcon_new(0,"nModified",uVar6,0xf,iVar3,"n",uVar7,0xf,iVar4,0);
  bVar1 = bson_iter_init(local_100,uVar6);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x229,"test_bson_iter_find_descendant","bson_iter_init (&iter, b)");
    abort();
  }
  bVar1 = bson_iter_find_descendant(local_100,"n",local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x22a,"test_bson_iter_find_descendant","bson_iter_find_descendant (&iter, \"n\", &desc)"
           );
    abort();
  }
  pcVar8 = (char *)bson_iter_key(local_180);
  iVar2 = strcmp(pcVar8,"n");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x22b,"test_bson_iter_find_descendant","!strcmp (bson_iter_key (&desc), \"n\")");
    abort();
  }
  bson_destroy(uVar6);
  uVar6 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(1);
  uVar7 = bson_bcon_magic();
  iVar4 = bcon_ensure_int32(2);
  uVar6 = bcon_new(0,"",uVar6,0xf,iVar3,"n",uVar7,0xf,iVar4,0);
  bVar1 = bson_iter_init(local_100,uVar6);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x22f,"test_bson_iter_find_descendant","bson_iter_init (&iter, b)");
    abort();
  }
  bVar1 = bson_iter_find_descendant(local_100,"n",local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x230,"test_bson_iter_find_descendant","bson_iter_find_descendant (&iter, \"n\", &desc)"
           );
    abort();
  }
  pcVar8 = (char *)bson_iter_key(local_180);
  iVar2 = strcmp(pcVar8,"n");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x231,"test_bson_iter_find_descendant","!strcmp (bson_iter_key (&desc), \"n\")");
    abort();
  }
  bson_destroy(uVar6);
  return;
}

Assistant:

static void
test_bson_iter_find_descendant (void)
{
   bson_iter_t iter;
   bson_iter_t desc;
   bson_t *b;

   b = get_bson (BINARY_DIR "/dotkey.bson");
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_find_descendant (&iter, "a.b.c.0", &desc));
   BSON_ASSERT (BSON_ITER_HOLDS_INT32 (&desc));
   BSON_ASSERT (bson_iter_int32 (&desc) == 1);
   bson_destroy (b);

   b = BCON_NEW (
      "foo", "{", "bar", "[", "{", "baz", BCON_INT32 (1), "}", "]", "}");
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_find_descendant (&iter, "foo.bar.0.baz", &desc));
   BSON_ASSERT (BSON_ITER_HOLDS_INT32 (&desc));
   BSON_ASSERT (bson_iter_int32 (&desc) == 1);
   bson_destroy (b);

   b = BCON_NEW ("nModified", BCON_INT32 (1), "n", BCON_INT32 (2));
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_find_descendant (&iter, "n", &desc));
   BSON_ASSERT (!strcmp (bson_iter_key (&desc), "n"));
   bson_destroy (b);

   b = BCON_NEW ("", BCON_INT32 (1), "n", BCON_INT32 (2));
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_find_descendant (&iter, "n", &desc));
   BSON_ASSERT (!strcmp (bson_iter_key (&desc), "n"));
   bson_destroy (b);
}